

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O3

void __thiscall cmm::BinaryOperatorAST::dump(BinaryOperatorAST *this,string *prefix)

{
  ExpressionAST *pEVar1;
  pointer pcVar2;
  ulong uVar3;
  ostream *poVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string OperatorSymbol;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  char *local_48;
  long local_40;
  char local_38 [16];
  
  local_40 = 0;
  local_38[0] = '\0';
  uVar3 = (ulong)*(uint *)&(this->super_ExpressionAST).field_0xc;
  local_48 = local_38;
  if (uVar3 < 0x14) {
    std::__cxx11::string::_M_replace
              ((ulong)&local_48,0,(char *)0x0,
               (ulong)(&DAT_0011b7e4 + *(int *)(&DAT_0011b7e4 + uVar3 * 4)));
  }
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_48,local_40);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"|---",4);
  pEVar1 = (this->LHS)._M_t.
           super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>._M_t.
           super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
           super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl;
  pcVar2 = (prefix->_M_dataplus)._M_p;
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_68,pcVar2,pcVar2 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)local_68);
  (*(pEVar1->super_AST)._vptr_AST[2])(pEVar1,local_68);
  if (local_68[0] != local_58) {
    operator_delete(local_68[0]);
  }
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"`---",4);
  pEVar1 = (this->RHS)._M_t.
           super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>._M_t.
           super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
           super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl;
  pcVar2 = (prefix->_M_dataplus)._M_p;
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_68,pcVar2,pcVar2 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)local_68);
  (*(pEVar1->super_AST)._vptr_AST[2])(pEVar1,local_68);
  if (local_68[0] != local_58) {
    operator_delete(local_68[0]);
  }
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  return;
}

Assistant:

void BinaryOperatorAST::dump(const std::string &prefix) const
{
  std::string OperatorSymbol;

  switch (getOpKind()) {
  default: break;
  case Add:           OperatorSymbol = "Add"; break;
  case Minus:         OperatorSymbol = "Sub"; break;
  case Multiply:      OperatorSymbol = "Mul"; break;
  case Division:      OperatorSymbol = "Div"; break;
  case Modulo:        OperatorSymbol = "Mod"; break;
  case LogicalAnd:    OperatorSymbol = "And"; break;
  case LogicalOr:     OperatorSymbol = "Or"; break;
  case Less:          OperatorSymbol = "Less"; break;
  case LessEqual:     OperatorSymbol = "LessEq"; break;
  case Equal:         OperatorSymbol = "Equal"; break;
  case NotEqual:      OperatorSymbol = "NotEq"; break;
  case Greater:       OperatorSymbol = "Greater"; break;
  case BitwiseAnd:    OperatorSymbol = "BitAnd"; break;
  case BitwiseOr:     OperatorSymbol = "BitOr"; break;
  case BitwiseXor:    OperatorSymbol = "Xor"; break;
  case LeftShift:     OperatorSymbol = "LShift"; break;
  case RightShift:    OperatorSymbol = "RShift"; break;
  case Assign:        OperatorSymbol = "Assign"; break;
  case GreaterEqual:  OperatorSymbol = "GreaterEq"; break;
  case Index:         OperatorSymbol = "At"; break;
  }

  std::cout << OperatorSymbol << "\n";

  std::cout << prefix << "|---";
  LHS->dump(prefix + "|   ");

  std::cout << prefix << "`---";
  RHS->dump(prefix + "    ");
}